

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

NodeSequence __thiscall
GraphBuilder::buildGeneralCallInstruction(GraphBuilder *this,CallInst *callInstruction)

{
  long lVar1;
  CallNode *this_00;
  CallInst *callInst;
  NodeSequence NVar2;
  
  lVar1 = *(long *)(callInstruction + -0x20);
  if (((lVar1 == 0) || (*(char *)(lVar1 + 0x10) != '\0')) ||
     (*(long *)(lVar1 + 0x18) != *(long *)(callInstruction + 0x48))) {
    this_00 = (CallNode *)operator_new(0x80);
    callInst = callInstruction;
    callInstruction = (CallInst *)(Instruction *)0x0;
  }
  else {
    this_00 = (CallNode *)operator_new(0x80);
    callInst = (CallInst *)0x0;
  }
  CallNode::CallNode(this_00,(Instruction *)callInstruction,callInst);
  NVar2.first = &addNode<CallNode>(this,this_00)->super_Node;
  NVar2.second = NVar2.first;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::buildGeneralCallInstruction(const CallInst *callInstruction) {
    CallNode *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = addNode(createNode<NodeType::CALL>(callInstruction));
    } else {
        callNode =
                addNode(createNode<NodeType::CALL>(nullptr, callInstruction));
    }
    return {callNode, callNode};
}